

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

opj_bool t2_read_packet_header
                   (opj_t2_v2_t *p_t2,opj_tcd_tile_v2_t *p_tile,opj_tcp_v2_t *p_tcp,
                   opj_pi_iterator_t *p_pi,opj_bool *p_is_data_present,OPJ_BYTE *p_src_data,
                   OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info)

{
  opj_tcd_seg_t *poVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  uint uVar5;
  opj_bool oVar6;
  opj_bio_t *bio;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  opj_cp_v2_t *poVar11;
  uchar *puVar12;
  OPJ_UINT32 i;
  ulong uVar13;
  opj_t2_v2_t *poVar14;
  long lVar15;
  opj_tcd_cblk_dec_v2_t *cblk;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_length;
  OPJ_UINT32 local_94;
  opj_cp_v2_t **local_88;
  opj_cp_v2_t *local_78;
  long local_70;
  uint local_68;
  OPJ_UINT32 local_64;
  long local_60;
  OPJ_BYTE *local_58;
  opj_cp_v2_t *local_50;
  opj_t2_v2_t *local_48;
  opj_bool *local_40;
  int local_34;
  
  lVar8 = (long)p_pi->resno * 0xb0 + (long)p_tile->distolayer[(long)p_pi->compno * 7 + -3];
  local_78 = (opj_cp_v2_t *)p_src_data;
  local_70 = lVar8;
  if ((p_pi->layno == 0) && (*(int *)(lVar8 + 0x18) != 0)) {
    piVar9 = (int *)(lVar8 + 0x20);
    uVar10 = 0;
    do {
      if ((piVar9[2] != *piVar9) && (piVar9[3] != piVar9[1])) {
        lVar15 = (long)p_pi->precno * 0x38 + *(long *)(piVar9 + 6);
        tgt_reset(*(opj_tgt_tree_t **)(lVar15 + 0x28));
        tgt_reset(*(opj_tgt_tree_t **)(lVar15 + 0x30));
        iVar2 = *(int *)(lVar15 + 0x14) * *(int *)(lVar15 + 0x10);
        lVar8 = local_70;
        if (iVar2 != 0) {
          lVar15 = *(long *)(lVar15 + 0x18) + 0x34;
          do {
            *(undefined8 *)(lVar15 + -4) = 0;
            lVar15 = lVar15 + 0x40;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
      }
      piVar9 = piVar9 + 0xc;
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(uint *)(lVar8 + 0x18));
  }
  poVar11 = (opj_cp_v2_t *)p_src_data;
  if ((((p_tcp->csty & 2) != 0) && (*p_src_data == 0xff)) && (p_src_data[1] == 0x91)) {
    poVar11 = (opj_cp_v2_t *)(p_src_data + 6);
    local_78 = poVar11;
  }
  bio = bio_create();
  oVar6 = 0;
  if (bio != (opj_bio_t *)0x0) {
    if (((ulong)p_t2[5].cp & 1) == 0) {
      if ((p_tcp->field_0x1628 & 1) == 0) {
        poVar14 = (opj_t2_v2_t *)&local_34;
        local_34 = (p_max_length + (int)p_src_data) - (int)poVar11;
        local_88 = &local_78;
      }
      else {
        local_88 = (opj_cp_v2_t **)&p_tcp->ppt_data;
        poVar11 = (opj_cp_v2_t *)p_tcp->ppt_data;
        poVar14 = (opj_t2_v2_t *)&p_tcp->ppt_len;
      }
    }
    else {
      local_88 = &p_t2[1].cp;
      poVar11 = p_t2[1].cp;
      poVar14 = p_t2 + 2;
    }
    bio_init_dec(bio,(uchar *)poVar11,*(OPJ_UINT32 *)&poVar14->cinfo);
    iVar2 = bio_read(bio,1);
    if (iVar2 == 0) {
      bio_inalign(bio);
      iVar2 = bio_numbytes(bio);
      puVar12 = (uchar *)((long)&poVar11->rsiz + (long)iVar2);
      bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*puVar12 == 0xff) && (puVar12[1] == 0x92)) {
          puVar12 = puVar12 + 2;
        }
        else {
          puts("Error : expected EPH marker");
        }
      }
      poVar11 = *local_88;
      uVar10 = (int)puVar12 - (int)poVar11;
      *(OPJ_UINT32 *)&poVar14->cinfo = *(OPJ_UINT32 *)&poVar14->cinfo - uVar10;
      *local_88 = (opj_cp_v2_t *)((long)&poVar11->rsiz + (ulong)uVar10);
      *p_is_data_present = 0;
      *p_data_read = (int)local_78 - (int)p_src_data;
    }
    else {
      uVar10 = *(uint *)(local_70 + 0x18);
      local_50 = poVar11;
      if (uVar10 != 0) {
        piVar9 = (int *)(local_70 + 0x20);
        uVar5 = 0;
        do {
          if ((piVar9[2] != *piVar9) && (piVar9[3] != piVar9[1])) {
            lVar8 = (long)p_pi->precno * 0x38 + *(long *)(piVar9 + 6);
            local_64 = *(int *)(lVar8 + 0x14) * *(int *)(lVar8 + 0x10);
            if (local_64 != 0) {
              cblk = *(opj_tcd_cblk_dec_v2_t **)(lVar8 + 0x18);
              local_94 = 0;
              local_68 = uVar5;
              local_60 = lVar8;
              local_58 = p_src_data;
              local_48 = poVar14;
              local_40 = p_is_data_present;
              do {
                if (cblk->numsegs == 0) {
                  OVar3 = tgt_decode(bio,*(opj_tgt_tree_t **)(local_60 + 0x28),local_94,
                                     p_pi->layno + 1);
                }
                else {
                  OVar3 = bio_read(bio,1);
                }
                lVar8 = local_60;
                if (OVar3 == 0) {
                  cblk->numnewpasses = 0;
                }
                else {
                  if (cblk->numsegs == 0) {
                    iVar2 = 0;
                    do {
                      OVar3 = tgt_decode(bio,*(opj_tgt_tree_t **)(lVar8 + 0x30),local_94,iVar2);
                      iVar2 = iVar2 + 1;
                    } while (OVar3 == 0);
                    cblk->numbps = (piVar9[9] - iVar2) + 2;
                    cblk->numlenbits = 3;
                  }
                  OVar3 = t2_getnumpasses(bio);
                  cblk->numnewpasses = OVar3;
                  iVar2 = -1;
                  do {
                    iVar4 = bio_read(bio,1);
                    iVar2 = iVar2 + 1;
                  } while (iVar4 != 0);
                  cblk->numlenbits = cblk->numlenbits + iVar2;
                  OVar3 = cblk->numsegs;
                  if (OVar3 == 0) {
                    OVar3 = 0;
                    iVar2 = t2_init_seg_v2(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_0020bf09:
                    uVar13 = (ulong)OVar3;
                    if (iVar2 == 0) goto LAB_0020bfdb;
                  }
                  else {
                    uVar13 = (ulong)(OVar3 - 1);
                    if (cblk->segs[uVar13].numpasses == cblk->segs[uVar13].maxpasses) {
                      iVar2 = t2_init_seg_v2(cblk,OVar3,p_tcp->tccps[p_pi->compno].cblksty,0);
                      goto LAB_0020bf09;
                    }
                  }
                  uVar10 = cblk->numnewpasses;
                  while( true ) {
                    poVar1 = cblk->segs;
                    uVar5 = poVar1[uVar13].maxpasses - poVar1[uVar13].numpasses;
                    if ((int)uVar10 <= (int)uVar5) {
                      uVar5 = uVar10;
                    }
                    poVar1[uVar13].numnewpasses = uVar5;
                    iVar2 = 0;
                    if (1 < uVar5) {
                      iVar2 = 0;
                      uVar7 = (ulong)uVar5;
                      do {
                        iVar2 = iVar2 + 1;
                        uVar5 = (uint)uVar7;
                        uVar7 = uVar7 >> 1;
                      } while (3 < uVar5);
                    }
                    OVar3 = bio_read(bio,iVar2 + cblk->numlenbits);
                    poVar1 = cblk->segs;
                    poVar1[uVar13].newlen = OVar3;
                    uVar10 = uVar10 - poVar1[uVar13].numnewpasses;
                    if ((int)uVar10 < 1) break;
                    uVar5 = (int)uVar13 + 1;
                    uVar13 = (ulong)uVar5;
                    oVar6 = t2_init_seg_v2(cblk,uVar5,p_tcp->tccps[p_pi->compno].cblksty,0);
                    if (oVar6 == 0) goto LAB_0020bfdb;
                  }
                }
                cblk = cblk + 1;
                local_94 = local_94 + 1;
              } while (local_94 != local_64);
              uVar10 = *(uint *)(local_70 + 0x18);
              p_is_data_present = local_40;
              poVar14 = local_48;
              p_src_data = local_58;
              uVar5 = local_68;
            }
          }
          piVar9 = piVar9 + 0xc;
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar10);
      }
      iVar2 = bio_inalign(bio);
      if (iVar2 != 0) {
LAB_0020bfdb:
        bio_destroy(bio);
        return 0;
      }
      iVar2 = bio_numbytes(bio);
      puVar12 = (uchar *)((long)&local_50->rsiz + (long)iVar2);
      bio_destroy(bio);
      if (((p_tcp->csty & 4) != 0) && (*puVar12 == 0xff)) {
        puVar12 = puVar12 + (ulong)(puVar12[1] == 0x92) * 2;
      }
      poVar11 = *local_88;
      uVar10 = (int)puVar12 - (int)poVar11;
      *(OPJ_UINT32 *)&poVar14->cinfo = *(OPJ_UINT32 *)&poVar14->cinfo - uVar10;
      *local_88 = (opj_cp_v2_t *)((long)&poVar11->rsiz + (ulong)uVar10);
      *p_is_data_present = 1;
      *p_data_read = (int)local_78 - (int)p_src_data;
    }
    oVar6 = 1;
  }
  return oVar6;
}

Assistant:

static opj_bool t2_read_packet_header(
							 opj_t2_v2_t* p_t2,
							 opj_tcd_tile_v2_t *p_tile,
                             opj_tcp_v2_t *p_tcp,
							 opj_pi_iterator_t *p_pi,
							 opj_bool * p_is_data_present,
							 OPJ_BYTE *p_src_data,
							 OPJ_UINT32 * p_data_read,
							 OPJ_UINT32 p_max_length,
							 opj_packet_info_t *p_pack_info)
{
	/* loop */
	OPJ_UINT32 bandno, cblkno;
	OPJ_UINT32 l_nb_code_blocks;
	OPJ_UINT32 l_remaining_length;
	OPJ_UINT32 l_header_length;
	OPJ_UINT32 * l_modified_length_ptr = 00;
	OPJ_BYTE *l_current_data = p_src_data;
	opj_cp_v2_t *l_cp = p_t2->cp;
	opj_bio_t *l_bio = 00;	/* BIO component */
	opj_tcd_band_v2_t *l_band = 00;
	opj_tcd_cblk_dec_v2_t* l_cblk = 00;
	opj_tcd_resolution_v2_t* l_res = &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

	OPJ_BYTE *l_header_data = 00;
	OPJ_BYTE **l_header_data_start = 00;

	OPJ_UINT32 l_present;

	if (p_pi->layno == 0) {
		l_band = l_res->bands;

		/* reset tagtrees */
		for (bandno = 0; bandno < l_res->numbands; ++bandno) {
			opj_tcd_precinct_v2_t *l_prc = &l_band->precincts[p_pi->precno];

			if ( ! ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) ) {
				tgt_reset(l_prc->incltree);
				tgt_reset(l_prc->imsbtree);
				l_cblk = l_prc->cblks.dec;

				l_nb_code_blocks = l_prc->cw * l_prc->ch;
				for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
					l_cblk->numsegs = 0;
					l_cblk->real_num_segs = 0;
					++l_cblk;
				}
			}

			++l_band;
		}
	}

	/* SOP markers */

	if (p_tcp->csty & J2K_CP_CSTY_SOP) {
		if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_WARNING, "Expected SOP marker\n"); */
		} else {
			l_current_data += 6;
		}

		/** TODO : check the Nsop value */
	}

	/*
	When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
	This part deal with this caracteristic
	step 1: Read packet header in the saved structure
	step 2: Return to codestream for decoding
	*/

	l_bio = bio_create();
	if (! l_bio) {
		return OPJ_FALSE;
	}

	if (l_cp->ppm == 1) { /* PPM */
		l_header_data_start = &l_cp->ppm_data;
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(l_cp->ppm_len);

	}
	else if (p_tcp->ppt == 1) { /* PPT */
		l_header_data_start = &(p_tcp->ppt_data);
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(p_tcp->ppt_len);
	}
	else {	/* Normal Case */
		l_header_data_start = &(l_current_data);
		l_header_data = *l_header_data_start;
		l_remaining_length = p_src_data+p_max_length-l_header_data;
		l_modified_length_ptr = &(l_remaining_length);
	}

	bio_init_dec(l_bio, l_header_data,*l_modified_length_ptr);

	l_present = bio_read(l_bio, 1);
	if (!l_present) {
		bio_inalign(l_bio);
		l_header_data += bio_numbytes(l_bio);
		bio_destroy(l_bio);

		/* EPH markers */
		if (p_tcp->csty & J2K_CP_CSTY_EPH) {
			if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
				printf("Error : expected EPH marker\n");
			} else {
				l_header_data += 2;
			}
		}

		l_header_length = (l_header_data - *l_header_data_start);
		*l_modified_length_ptr -= l_header_length;
		*l_header_data_start += l_header_length;

		/* << INDEX */
		/* End of packet header position. Currently only represents the distance to start of packet
		   Will be updated later by incrementing with packet start value */
		if (p_pack_info) {
			p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
		}
		/* INDEX >> */

		* p_is_data_present = OPJ_FALSE;
		*p_data_read = l_current_data - p_src_data;
		return OPJ_TRUE;
	}

	l_band = l_res->bands;
	for (bandno = 0; bandno < l_res->numbands; ++bandno) {
		opj_tcd_precinct_v2_t *l_prc = &(l_band->precincts[p_pi->precno]);

		if ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) {
			++l_band;
			continue;
		}

		l_nb_code_blocks = l_prc->cw * l_prc->ch;
		l_cblk = l_prc->cblks.dec;
		for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
			OPJ_UINT32 l_included,l_increment, l_segno;
			OPJ_INT32 n;

			/* if cblk not yet included before --> inclusion tagtree */
			if (!l_cblk->numsegs) {
				l_included = tgt_decode(l_bio, l_prc->incltree, cblkno, p_pi->layno + 1);
				/* else one bit */
			}
			else {
				l_included = bio_read(l_bio, 1);
			}

			/* if cblk not included */
			if (!l_included) {
				l_cblk->numnewpasses = 0;
				++l_cblk;
				continue;
			}

			/* if cblk not yet included --> zero-bitplane tagtree */
			if (!l_cblk->numsegs) {
				OPJ_UINT32 i = 0;

				while (!tgt_decode(l_bio, l_prc->imsbtree, cblkno, i)) {
					++i;
				}

				l_cblk->numbps = l_band->numbps + 1 - i;
				l_cblk->numlenbits = 3;
			}

			/* number of coding passes */
			l_cblk->numnewpasses = t2_getnumpasses(l_bio);
			l_increment = t2_getcommacode(l_bio);

			/* length indicator increment */
			l_cblk->numlenbits += l_increment;
			l_segno = 0;

			if (!l_cblk->numsegs) {
				if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
					bio_destroy(l_bio);
					return OPJ_FALSE;
				}
			}
			else {
				l_segno = l_cblk->numsegs - 1;
				if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
					++l_segno;
					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			}
			n = l_cblk->numnewpasses;

			do {
				l_cblk->segs[l_segno].numnewpasses = int_min(l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses, n);
				l_cblk->segs[l_segno].newlen = bio_read(l_bio, l_cblk->numlenbits + uint_floorlog2(l_cblk->segs[l_segno].numnewpasses));

				n -= l_cblk->segs[l_segno].numnewpasses;
				if (n > 0) {
					++l_segno;

					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			} while (n > 0);

			++l_cblk;
		}

		++l_band;
	}

	if (bio_inalign(l_bio)) {
		bio_destroy(l_bio);
		return OPJ_FALSE;
	}

	l_header_data += bio_numbytes(l_bio);
	bio_destroy(l_bio);

	/* EPH markers */
	if (p_tcp->csty & J2K_CP_CSTY_EPH) {
		if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_ERROR, "Expected EPH marker\n"); */
		} else {
			l_header_data += 2;
		}
	}

	l_header_length = (l_header_data - *l_header_data_start);
	*l_modified_length_ptr -= l_header_length;
	*l_header_data_start += l_header_length;

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	 Will be updated later by incrementing with packet start value */
	if (p_pack_info) {
		p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
	}
	/* INDEX >> */

	*p_is_data_present = OPJ_TRUE;
	*p_data_read = l_current_data - p_src_data;

	return OPJ_TRUE;
}